

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void processCompileOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  _Base_ptr *pp_Var1;
  char *pcVar2;
  long *plVar3;
  cmake *this;
  undefined8 *puVar4;
  cmGeneratorExpressionDAGChecker *pcVar5;
  GeneratorExpressionContent *pGVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  value_type *__x;
  _func_int **pp_Var9;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  undefined7 in_stack_00000009;
  string *in_stack_00000020;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  undefined1 local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  _Base_ptr *local_120;
  undefined8 local_118;
  _Base_ptr local_110;
  undefined8 uStack_108;
  cmGeneratorTarget *local_100;
  GeneratorExpressionContent *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  Entry *local_d8;
  pointer local_d0;
  undefined1 local_c8 [64];
  long local_88;
  Entry *local_80 [2];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  cmListFileBacktrace local_50;
  
  if (entries !=
      (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       *)options) {
    local_100 = tgt;
    local_60._M_allocated_capacity = (size_type)options;
    local_60._8_8_ = config;
    do {
      paVar8 = &local_140.field_2;
      local_c8._48_8_ = (value_type *)0x0;
      local_c8._56_8_ = (value_type *)0x0;
      local_88 = 0;
      pcVar2 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,local_100->LocalGenerator,
                          (string *)CONCAT71(in_stack_00000009,debugOptions),false,local_100,
                          (cmGeneratorExpressionDAGChecker *)local_60._8_8_,in_stack_00000020);
      std::__cxx11::string::string((string *)&local_140,pcVar2,(allocator *)local_180);
      cmSystemTools::ExpandListArgument
                (&local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_c8 + 0x30),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar8) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      local_140._M_string_length = 0;
      local_140.field_2._M_local_buf[0] = '\0';
      __x = (value_type *)local_c8._48_8_;
      local_140._M_dataplus._M_p = (pointer)paVar8;
      if (local_c8._48_8_ != local_c8._56_8_) {
        do {
          local_180._0_8_ = dagChecker;
          pVar10 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)dagChecker,__x,(string *)local_180);
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)uniqueOptions,__x);
            if ((char)logName != '\0') {
              std::operator+(&local_160," * ",__x);
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
              local_180._0_8_ = local_180 + 0x10;
              pcVar5 = (cmGeneratorExpressionDAGChecker *)(plVar3 + 2);
              if ((cmGeneratorExpressionDAGChecker *)*plVar3 == pcVar5) {
                local_180._16_8_ = pcVar5->Parent;
                local_180._24_8_ = plVar3[3];
              }
              else {
                local_180._16_8_ = pcVar5->Parent;
                local_180._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar3;
              }
              local_180._8_8_ = plVar3[1];
              *plVar3 = (long)pcVar5;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_140,local_180._0_8_);
              if ((cmGeneratorExpressionDAGChecker *)local_180._0_8_ !=
                  (cmGeneratorExpressionDAGChecker *)(local_180 + 0x10)) {
                operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
            }
          }
          __x = __x + 1;
        } while (__x != (value_type *)local_c8._56_8_);
        if (local_140._M_string_length != 0) {
          this = cmLocalGenerator::GetCMakeInstance(local_100->LocalGenerator);
          local_80[0] = (Entry *)&local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Used compile ","");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_80);
          local_f8 = (GeneratorExpressionContent *)local_e8;
          pGVar6 = (GeneratorExpressionContent *)(plVar3 + 2);
          if ((GeneratorExpressionContent *)*plVar3 == pGVar6) {
            local_e8._0_8_ =
                 (pGVar6->super_cmGeneratorExpressionEvaluator)._vptr_cmGeneratorExpressionEvaluator
            ;
            local_e8._8_4_ = (undefined4)plVar3[3];
            local_e8._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_e8._0_8_ =
                 (pGVar6->super_cmGeneratorExpressionEvaluator)._vptr_cmGeneratorExpressionEvaluator
            ;
            local_f8 = (GeneratorExpressionContent *)*plVar3;
          }
          local_f0 = plVar3[1];
          *plVar3 = (long)pGVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_d8 = (Entry *)local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," for target ","");
          pp_Var9 = (_func_int **)0xf;
          if (local_f8 != (GeneratorExpressionContent *)local_e8) {
            pp_Var9 = (_func_int **)local_e8._0_8_;
          }
          if (pp_Var9 < (_func_int **)((long)local_d0 + local_f0)) {
            pp_Var9 = (_func_int **)0xf;
            if (local_d8 != (Entry *)local_c8) {
              pp_Var9 = (_func_int **)local_c8._0_8_;
            }
            if (pp_Var9 < (_func_int **)((long)local_d0 + local_f0)) goto LAB_004a0d4e;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
          }
          else {
LAB_004a0d4e:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
          }
          local_120 = &local_110;
          pp_Var1 = (_Base_ptr *)(puVar4 + 2);
          if ((_Base_ptr *)*puVar4 == pp_Var1) {
            local_110 = *pp_Var1;
            uStack_108 = puVar4[3];
          }
          else {
            local_110 = *pp_Var1;
            local_120 = (_Base_ptr *)*puVar4;
          }
          local_118 = puVar4[1];
          *puVar4 = pp_Var1;
          puVar4[1] = 0;
          *(undefined1 *)pp_Var1 = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_120,
                                      (ulong)(local_100->Target->Name)._M_dataplus._M_p);
          local_c8._16_8_ = local_c8 + 0x20;
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_c8._32_8_ = *plVar7;
            local_c8._40_8_ = plVar3[3];
          }
          else {
            local_c8._32_8_ = *plVar7;
            local_c8._16_8_ = (long *)*plVar3;
          }
          local_c8._24_8_ = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append(local_c8 + 0x10);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar8) {
            local_160.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_160.field_2._8_8_ = plVar3[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_160._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_160._M_string_length = plVar3[1];
          *plVar3 = (long)paVar8;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
          local_180._0_8_ = local_180 + 0x10;
          pcVar5 = (cmGeneratorExpressionDAGChecker *)(plVar3 + 2);
          if ((cmGeneratorExpressionDAGChecker *)*plVar3 == pcVar5) {
            local_180._16_8_ = pcVar5->Parent;
            local_180._24_8_ = plVar3[3];
          }
          else {
            local_180._16_8_ = pcVar5->Parent;
            local_180._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar3;
          }
          local_180._8_8_ = plVar3[1];
          *plVar3 = (long)pcVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          cmListFileBacktrace::cmListFileBacktrace
                    (&local_50,(cmListFileBacktrace *)((*(pointer *)entries)->_M_dataplus)._M_p);
          cmake::IssueMessage(this,LOG,(string *)local_180,&local_50);
          cmListFileBacktrace::~cmListFileBacktrace(&local_50);
          if ((cmGeneratorExpressionDAGChecker *)local_180._0_8_ !=
              (cmGeneratorExpressionDAGChecker *)(local_180 + 0x10)) {
            operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_c8._16_8_ != local_c8 + 0x20) {
            operator_delete((void *)local_c8._16_8_,(ulong)(local_c8._32_8_ + 1));
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,(ulong)((long)&local_110->_M_color + 1));
          }
          if (local_d8 != (Entry *)local_c8) {
            operator_delete(local_d8,(ulong)(local_c8._0_8_ + 1));
          }
          if (local_f8 != (GeneratorExpressionContent *)local_e8) {
            operator_delete(local_f8,local_e8._0_8_ + 1);
          }
          if (local_80[0] != (Entry *)&local_70) {
            operator_delete(local_80[0],(ulong)(local_70._M_p + 1));
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_c8 + 0x30));
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)((long)entries + 8);
    } while (entries !=
             (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              *)local_60._M_allocated_capacity);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<std::string>& options,
  CM_UNORDERED_SET<std::string>& uniqueOptions,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugOptions, const char* logName, std::string const& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry *>::const_iterator
         it = entries.begin(),
         end = entries.end();
       it != end; ++it) {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument(
      (*it)->ge->Evaluate(tgt->GetLocalGenerator(), config, false, tgt,
                          dagChecker, language),
      entryOptions);
    std::string usedOptions;
    for (std::vector<std::string>::iterator li = entryOptions.begin();
         li != entryOptions.end(); ++li) {
      std::string const& opt = *li;

      if (uniqueOptions.insert(opt).second) {
        options.push_back(opt);
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        cmake::LOG, std::string("Used compile ") + logName +
          std::string(" for target ") + tgt->GetName() + ":\n" + usedOptions,
        (*it)->ge->GetBacktrace());
    }
  }
}